

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ab_algorithm.c
# Opt level: O2

void aba_a(void)

{
  int i_1;
  long lVar1;
  long lVar2;
  int i;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  solver_state_a s;
  
  setup_simple_state_a(&two_dof_robot_a,&s);
  lVar3 = 1;
  lVar5 = 0x18;
  lVar2 = 0x20;
  lVar1 = 0x48;
  while( true ) {
    uVar7 = (ulong)s.nbody;
    if ((long)uVar7 < lVar3) break;
    lVar6 = _two_dof_robot_c + lVar1 + -0x28;
    kca_fpk(lVar6,(long)&s.x_jnt[-1].target_body + lVar2);
    ga_pose_compose((long)&s.x_jnt[-1].target_body + lVar2,_two_dof_robot_c + lVar1 + -0x48,
                    (long)&s.x_rel[-1].target_body + lVar2);
    kca_fvk(lVar6,(long)&s.xd_jnt[-1].target_body + lVar2);
    ga_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].target_body + lVar2,(long)&s.xd[-1].target_body + lVar2,
               (long)&s.xd_tf[-1].target_body + lVar2);
    ga_twist_accumulate((long)&s.xd_tf[-1].target_body + lVar2,
                        (long)&s.xd_jnt[-1].target_body + lVar2,(long)&(s.xd)->target_body + lVar2);
    kca_inertial_acceleration
              (lVar6,(long)&(s.xd)->target_body + lVar2,(long)&s.xdd_bias[-1].target_body + lVar2);
    ma_rbi_to_abi(_two_dof_robot_c + lVar1,(long)&(s.m_art)->body + lVar5);
    ma_rbi_map_twist_to_momentum
              (_two_dof_robot_c + lVar1,(long)&(s.xd)->target_body + lVar2,
               (long)&s.p[-1].body + lVar5);
    ma_momentum_derive((long)&(s.xd)->target_body + lVar2,(long)&s.p[-1].body + lVar5,
                       (long)&(s.f_bias_art)->body + lVar5);
    ma_wrench_invert((long)&s.f_ext[-1].body + lVar5,(long)&(s.f_ext_art)->body + lVar5);
    lVar3 = lVar3 + 1;
    lVar5 = lVar5 + 0x18;
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 0x60;
  }
  uVar4 = (ulong)(uint)s.nbody;
  lVar2 = uVar4 * 0x60 + -0x40;
  lVar3 = uVar4 << 5;
  lVar5 = uVar4 * 0x18;
  while( true ) {
    if ((int)uVar7 < 1) break;
    lVar6 = _two_dof_robot_c + lVar2;
    kca_project_inertia(lVar6,(long)&(s.m_art)->body + lVar5,(long)&s.m_app[-1].body + lVar5);
    ma_abi_tf_tgt_to_ref
              ((long)&s.x_rel[-1].target_body + lVar3,(long)&s.m_app[-1].body + lVar5,
               (long)&(s.m_tf)->body + lVar5);
    lVar1 = (long)&s.m_art[-1].body + lVar5;
    ma_abi_add(lVar1,(long)&(s.m_tf)->body + lVar5,lVar1);
    ma_abi_map_acc_twist_to_wrench
              ((long)&(s.m_art)->body + lVar5,(long)&s.xdd_bias[-1].target_body + lVar3,
               (long)&s.f_bias_eom[-1].body + lVar5);
    lVar1 = (long)&s.f_bias_eom[-1].body + lVar5;
    ma_wrench_add(lVar1,(long)&(s.f_bias_art)->body + lVar5,lVar1);
    kca_project_wrench(lVar6,(long)&(s.m_art)->body + lVar5,(long)&s.f_bias_eom[-1].body + lVar5,
                       (long)&s.f_bias_app[-1].body + lVar5);
    ma_wrench_tf_tgt_to_ref
              ((long)&s.x_rel[-1].target_body + lVar3,(long)&s.f_bias_app[-1].body + lVar5,
               (long)&s.f_bias_tf[-1].body + lVar5);
    lVar1 = (long)&s.f_bias_art[-1].body + lVar5;
    ma_wrench_add(lVar1,(long)&s.f_bias_tf[-1].body + lVar5,lVar1);
    kca_ffd(lVar6,(long)&(s.m_art)->body + lVar5,(long)&s.f_ff_jnt[-1].body + lVar5);
    kca_project_wrench(lVar6,(long)&(s.m_art)->body + lVar5,(long)&(s.f_ff_art)->body + lVar5,
                       (long)&s.f_ff_app[-1].body + lVar5);
    lVar1 = (long)&s.f_ff_app[-1].body + lVar5;
    ma_wrench_add(lVar1,(long)&s.f_ff_jnt[-1].body + lVar5,lVar1);
    ma_wrench_tf_tgt_to_ref
              ((long)&s.x_rel[-1].target_body + lVar3,(long)&s.f_ff_app[-1].body + lVar5,
               (long)&s.f_ff_art[-1].body + lVar5);
    kca_project_wrench(lVar6,(long)&(s.m_art)->body + lVar5,(long)&(s.f_ext_art)->body + lVar5,
                       (long)&s.f_ext_app[-1].body + lVar5);
    ma_wrench_tf_tgt_to_ref
              ((long)&s.x_rel[-1].target_body + lVar3,(long)&s.f_ext_app[-1].body + lVar5,
               (long)&s.f_ext_tf[-1].body + lVar5);
    lVar1 = (long)&s.f_ext_art[-1].body + lVar5;
    ma_wrench_add(lVar1,(long)&s.f_ext_tf[-1].body + lVar5,lVar1);
    lVar2 = lVar2 + -0x60;
    uVar7 = (ulong)((int)uVar7 - 1);
    lVar3 = lVar3 + -0x20;
    lVar5 = lVar5 + -0x18;
  }
  ma_abi_log(s.m_art);
  ma_wrench_log(s.f_bias_art);
  ma_wrench_log(s.f_ff_art);
  ma_wrench_log(s.f_ext_art);
  lVar5 = 0x18;
  lVar2 = 0x20;
  lVar1 = lVar2;
  for (lVar3 = 1; lVar3 <= s.nbody; lVar3 = lVar3 + 1) {
    lVar6 = _two_dof_robot_c + lVar2;
    ga_acc_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].target_body + lVar1,(long)&s.xdd[-1].target_body + lVar1,
               (long)&s.xdd_tf[-1].target_body + lVar1);
    ga_acc_twist_accumulate
              ((long)&s.xdd_tf[-1].target_body + lVar1,(long)&s.xdd_bias[-1].target_body + lVar1,
               (long)&s.xdd_nact[-1].target_body + lVar1);
    ma_abi_map_acc_twist_to_wrench
              ((long)&(s.m_art)->body + lVar5,(long)&s.xdd_nact[-1].target_body + lVar1,
               (long)&s.f_bias_nact[-1].body + lVar5);
    kca_ifk(lVar6,(long)&s.f_bias_nact[-1].body + lVar5);
    kca_ifk(lVar6,(long)&(s.f_ff_art)->body + lVar5);
    kca_ifk(lVar6,(long)&(s.f_ext_art)->body + lVar5);
    kca_fak(lVar6,(long)&s.xdd_jnt[-1].target_body + lVar1);
    ga_acc_twist_add((long)&s.xdd_jnt[-1].target_body + lVar1,
                     (long)&s.xdd_bias[-1].target_body + lVar1,
                     (long)&s.xdd_net[-1].target_body + lVar1);
    ga_acc_twist_accumulate
              ((long)&s.xdd_tf[-1].target_body + lVar1,(long)&s.xdd_net[-1].target_body + lVar1,
               (long)&(s.xdd)->target_body + lVar1);
    lVar1 = lVar1 + 0x20;
    lVar5 = lVar5 + 0x18;
    lVar2 = lVar2 + 0x60;
  }
  ga_acc_twist_log(s.xdd + s.nbody);
  return;
}

Assistant:

void aba_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);


        // Inertia
        //

        // M_i^A = M_i
        ma_rbi_to_abi(&kc->segment[i - 1].link.inertia, &s.m_art[i]);


        // Force
        //

        // p_i = M_i Xd_i
        ma_rbi_map_twist_to_momentum(&kc->segment[i - 1].link.inertia, &s.xd[i], &s.p[i - 1]);

        // F_{bias,i}^A = Xd_i x* P_i
        ma_momentum_derive(&s.xd[i], &s.p[i - 1], &s.f_bias_art[i]);


        // F_{ext,i}^A = -F_{ext,i}
        ma_wrench_invert(&s.f_ext[i - 1], &s.f_ext_art[i]);
    }


    for (int i = s.nbody; i > 0; i--) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Inertia
        //

        // M_i^a = P_i^T M_i^A
        kca_project_inertia(joint, &s.m_art[i], &s.m_app[i - 1]);

        // M_{i-1}^a' = {i-1}^X_i* M_i^a i^X_{i-1}
        ma_abi_tf_tgt_to_ref(&s.x_rel[i - 1], &s.m_app[i - 1], &s.m_tf[i]);

        // M_{i-1}^A += M_{i-1}^a'
        ma_abi_add(&s.m_art[i - 1], &s.m_tf[i], &s.m_art[i - 1]);


        // Force
        //

        // F_{bias,i}^A' = M_i^A Xdd_{bias,i}
        ma_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_bias[i - 1], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^A' += F_{bias,i}^A
        ma_wrench_add(&s.f_bias_eom[i - 1], &s.f_bias_art[i], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^a = P_i^T F_{bias,i}^A'
        kca_project_wrench(joint, &s.m_art[i], &s.f_bias_eom[i - 1], &s.f_bias_app[i - 1]);

        // F_{bias,i}^a' = {i-1}^X_i* F_{bias,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_bias_app[i - 1], &s.f_bias_tf[i - 1]);

        // F_{bias,i-1}^A += F_{bias,i}^a'
        ma_wrench_add(&s.f_bias_art[i - 1], &s.f_bias_tf[i - 1], &s.f_bias_art[i - 1]);


        // F_{tau,i} = M_i^A S_i D^{-1} tau_{ff,i}
        kca_ffd(joint, &s.m_art[i], &s.f_ff_jnt[i - 1]);

        // F_{tau,i}^a = P_i^T F_{tau,i}^A
        kca_project_wrench(joint, &s.m_art[i], &s.f_ff_art[i], &s.f_ff_app[i - 1]);

        // F_{tau,i}^a += F_{tau,i}'
        ma_wrench_add(&s.f_ff_app[i - 1], &s.f_ff_jnt[i - 1], &s.f_ff_app[i - 1]);

        // F_{tau,i-1}^A = {i-1}^X_i* F_{tau,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ff_app[i - 1], &s.f_ff_art[i - 1]);


        // F_{ext,i}^a = P_i^T F_{ext,i}^A
        kca_project_wrench(joint, &s.m_art[i], &s.f_ext_art[i], &s.f_ext_app[i - 1]);

        // F_{ext,i}^a' = {i-1}^X_i* F_{ext,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ext_app[i - 1], &s.f_ext_tf[i - 1]);

        // F_{ext,i-1}^A += F_{ext,i}^a'
        ma_wrench_add(&s.f_ext_art[i - 1], &s.f_ext_tf[i - 1], &s.f_ext_art[i - 1]);
    }

    ma_abi_log(&s.m_art[0]);
    ma_wrench_log(&s.f_bias_art[0]);
    ma_wrench_log(&s.f_ff_art[0]);
    ma_wrench_log(&s.f_ext_art[0]);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Acceleration
        //

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_{nact,i-1} = Xdd_{i-1}' + Xdd_{bias,i-1}
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_bias[i - 1], &s.xdd_nact[i - 1]);


        // Force
        //

        // F_{nact,i} = M_i^A Xdd_{nact,i-1}'
        ma_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_nact[i - 1], &s.f_bias_nact[i - 1]);

        // tau_{bias,i} = S^T F_{bias,i}
        kca_ifk(joint, &s.f_bias_nact[i - 1]);


        // tau_{ff,i}^A = S^T F_{ff,i}
        kca_ifk(joint, &s.f_ff_art[i]);


        // tau_{ext,i}^A = S^T F_{ext,i}
        kca_ifk(joint, &s.f_ext_art[i]);


        // Resultant acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}